

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void evthread_notify_drain_default(int fd,short what,void *arg)

{
  ssize_t sVar1;
  uchar buf [1024];
  undefined1 auStack_418 [1024];
  
  do {
    sVar1 = read(fd,auStack_418,0x400);
  } while (0 < sVar1);
  if (*(void **)((long)arg + 0x1b0) == (void *)0x0) {
    *(undefined4 *)((long)arg + 0x1f0) = 0;
  }
  else {
    (*evthread_lock_fns_.lock)(0,*(void **)((long)arg + 0x1b0));
    *(undefined4 *)((long)arg + 0x1f0) = 0;
    if (*(void **)((long)arg + 0x1b0) != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,*(void **)((long)arg + 0x1b0));
      return;
    }
  }
  return;
}

Assistant:

static void
evthread_notify_drain_default(evutil_socket_t fd, short what, void *arg)
{
	unsigned char buf[1024];
	struct event_base *base = arg;
#ifdef _WIN32
	while (recv(fd, (char*)buf, sizeof(buf), 0) > 0)
		;
#else
	while (read(fd, (char*)buf, sizeof(buf)) > 0)
		;
#endif

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	base->is_notify_pending = 0;
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}